

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O3

void __thiscall xmrig::Workers<xmrig::CpuLaunchData>::Workers(Workers<xmrig::CpuLaunchData> *this)

{
  WorkersPrivate *pWVar1;
  
  (this->m_workers).
  super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_workers).
  super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_workers).
  super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar1 = (WorkersPrivate *)operator_new(0x10);
  pWVar1->hashrate = (Hashrate *)0x0;
  pWVar1->backend = (IBackend *)0x0;
  this->d_ptr = pWVar1;
  return;
}

Assistant:

xmrig::Workers<T>::Workers() :
    d_ptr(new WorkersPrivate())
{

}